

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int f_setvbuf(lua_State *L)

{
  int iVar1;
  FILE *__stream;
  size_t __n;
  
  __stream = (FILE *)tofile(L);
  iVar1 = luaL_checkoption(L,2,(char *)0x0,f_setvbuf::modenames);
  __n = luaL_optinteger(L,3,0x2000);
  iVar1 = setvbuf(__stream,(char *)0x0,f_setvbuf::mode[iVar1],__n);
  iVar1 = luaL_fileresult(L,(uint)(iVar1 == 0),(char *)0x0);
  return iVar1;
}

Assistant:

static int f_setvbuf (lua_State *L) {
  static const int mode[] = {_IONBF, _IOFBF, _IOLBF};
  static const char *const modenames[] = {"no", "full", "line", NULL};
  FILE *f = tofile(L);
  int op = luaL_checkoption(L, 2, NULL, modenames);
  lua_Integer sz = luaL_optinteger(L, 3, LUAL_BUFFERSIZE);
  int res = setvbuf(f, NULL, mode[op], sz);
  return luaL_fileresult(L, res == 0, NULL);
}